

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  ExtendedKalmanFilter *pEVar1;
  IMUElasticLocalFrameDynamicalSystem *this_00;
  Vector *this_01;
  _func_int **pp_Var2;
  double *pdVar3;
  bool bVar4;
  _func_int *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _func_int **pp_Var8;
  int iVar9;
  Index IVar10;
  int extraout_var;
  double *pdVar11;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar12;
  undefined8 *puVar13;
  Index index_4;
  ulong uVar14;
  ulong uVar15;
  Index index;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Index size;
  long lVar19;
  long lVar20;
  ActualDstType actualDst;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  Vector dx;
  Vector x0;
  Vector3 v2;
  Vector3 v1;
  DenseStorage<double,__1,__1,_1,_0> local_128;
  ExtendedKalmanFilter *local_118;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_110;
  ObserverBase local_f0;
  Scalar local_d0;
  DenseStorage<double,__1,__1,_1,_0> local_c8;
  Matrix<double,_3,_1,_0,_3,_1> local_b8;
  Matrix<double,_3,_1,_0,_3,_1> local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_78;
  
  local_78.m_lhs.m_rows.m_value = 1;
  local_78._0_8_ = 0x23;
  local_78.m_lhs.m_cols.m_value = 0x3e45798ee2308c3a;
  local_118 = (ExtendedKalmanFilter *)dt;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_110,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_78);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x30,(Vector *)&local_110);
  free(local_110.m_xpr);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_001b5318;
  this_00 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem
            (this_00,(double)local_118);
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  *(undefined1 (*) [16])
   &(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (undefined1  [16])0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
       (DenseStorage<double,__1,__1,_1,_0>)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  local_78.m_lhs.m_rows.m_value = 6;
  local_78.m_lhs.m_cols.m_value = 6;
  local_78.m_rhs.m_rows.m_value = 6;
  local_78.m_rhs.m_cols.m_value = 6;
  local_78.m_rhs.m_functor.m_other = 0.0001;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&this->forceVariance_,&local_78,(assign_op<double,_double> *)&local_110);
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withAbsolutePos_ = false;
  this->withComBias_ = false;
  this->withUnmodeledForces_ = false;
  this->limitOn_ = true;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  *(undefined1 (*) [16])
   &(this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = (undefined1  [16])0x0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_f0.m_ = (Index)&this->forceVariance_;
  IVar10 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(this_00);
  pEVar1 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::setMeasureSize(&pEVar1->super_KalmanFilterBase,IVar10);
  KalmanFilterBase::setStateSize(&pEVar1->super_KalmanFilterBase,this->stateSize_);
  IVar10 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_00);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)pEVar1,IVar10);
  IVar10 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_00);
  this->inputSize_ = IVar10;
  resetCovarianceMatrices(this);
  iVar9 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  uVar16 = CONCAT44(extraout_var,iVar9);
  if (extraout_var < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_118 = pEVar1;
  if (uVar16 == 0) {
    uVar18 = 0;
  }
  else {
    if (0x1fffffffffffffff < uVar16) {
LAB_0014f3bd:
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = operator_delete;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pdVar11 = (double *)malloc(uVar16 * 8);
    if (uVar16 != 1 && ((ulong)pdVar11 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar11 == (double *)0x0) goto LAB_0014f3bd;
    local_128.m_data = pdVar11;
    local_128.m_rows = uVar16;
    if (uVar16 == 1) {
      uVar18 = 0;
    }
    else {
      uVar18 = uVar16 & 0x1ffffffffffffffe;
      uVar14 = 0;
      do {
        pdVar11[uVar14] = 1e-08;
        (pdVar11 + uVar14)[1] = 1e-08;
        uVar14 = uVar14 + 2;
      } while (uVar14 < uVar18);
    }
  }
  pEVar1 = local_118;
  auVar7 = _DAT_00183020;
  auVar6 = _DAT_00183010;
  lVar19 = uVar16 - uVar18;
  if (lVar19 != 0 && (long)uVar18 <= (long)uVar16) {
    lVar20 = lVar19 + -1;
    auVar21._8_4_ = (int)lVar20;
    auVar21._0_8_ = lVar20;
    auVar21._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar14 = 0;
    auVar21 = auVar21 ^ _DAT_00183020;
    do {
      auVar28._8_4_ = (int)uVar14;
      auVar28._0_8_ = uVar14;
      auVar28._12_4_ = (int)(uVar14 >> 0x20);
      auVar28 = (auVar28 | auVar6) ^ auVar7;
      bVar4 = auVar21._0_4_ < auVar28._0_4_;
      iVar9 = auVar21._4_4_;
      iVar31 = auVar28._4_4_;
      if ((bool)(~(iVar9 < iVar31 || iVar31 == iVar9 && bVar4) & 1)) {
        local_128.m_data[uVar18 + uVar14] = 1e-08;
      }
      if (iVar9 >= iVar31 && (iVar31 != iVar9 || !bVar4)) {
        local_128.m_data[uVar18 + uVar14 + 1] = 1e-08;
      }
      uVar14 = uVar14 + 2;
      uVar16 = local_128.m_rows;
    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar14);
  }
  auVar7 = _DAT_00183040;
  auVar6 = _DAT_00183020;
  if ((long)uVar16 < 6) goto LAB_0014f39e;
  pdVar11 = local_128.m_data + 3;
  uVar16 = 3;
  if (((ulong)pdVar11 & 7) == 0) {
    uVar16 = (ulong)((uint)((ulong)pdVar11 >> 3) & 1);
  }
  uVar14 = uVar16 ^ 3;
  uVar15 = (ulong)((uint)(1 < uVar14) * 2);
  uVar18 = uVar15 + uVar16;
  if (uVar16 == 0) {
LAB_0014ee03:
    do {
      pdVar11[uVar16] = 0.0001;
      (pdVar11 + uVar16)[1] = 0.0001;
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar18);
  }
  else {
    lVar19 = uVar16 - 1;
    auVar22._8_4_ = (int)lVar19;
    auVar22._0_8_ = lVar19;
    auVar22._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar17 = 0;
    auVar22 = auVar22 ^ _DAT_00183020;
    auVar26 = _DAT_00183010;
    do {
      bVar4 = auVar22._0_4_ < SUB164(auVar26 ^ auVar6,0);
      iVar9 = auVar22._4_4_;
      iVar31 = SUB164(auVar26 ^ auVar6,4);
      if ((bool)(~(iVar9 < iVar31 || iVar31 == iVar9 && bVar4) & 1)) {
        *(undefined8 *)((long)local_128.m_data + uVar17 + 0x18) = 0x3f1a36e2eb1c432d;
      }
      if (iVar9 >= iVar31 && (iVar31 != iVar9 || !bVar4)) {
        *(undefined8 *)((long)local_128.m_data + uVar17 + 0x20) = 0x3f1a36e2eb1c432d;
      }
      lVar19 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + auVar7._0_8_;
      auVar26._8_8_ = lVar19 + auVar7._8_8_;
      uVar17 = uVar17 + 0x10;
    } while (((int)uVar16 * 8 + 8U & 0xfffffff0) != uVar17);
    if (1 < (uint)uVar14) goto LAB_0014ee03;
  }
  auVar7 = _DAT_00183020;
  auVar6 = _DAT_00183010;
  if ((uint)uVar18 < 3) {
    lVar19 = uVar14 - uVar15;
    lVar20 = lVar19 + -1;
    auVar23._8_4_ = (int)lVar20;
    auVar23._0_8_ = lVar20;
    auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar16 = 0;
    auVar23 = auVar23 ^ _DAT_00183020;
    do {
      auVar29._8_4_ = (int)uVar16;
      auVar29._0_8_ = uVar16;
      auVar29._12_4_ = (int)(uVar16 >> 0x20);
      auVar21 = (auVar29 | auVar6) ^ auVar7;
      bVar4 = auVar23._0_4_ < auVar21._0_4_;
      iVar9 = auVar23._4_4_;
      iVar31 = auVar21._4_4_;
      if ((bool)(~(iVar9 < iVar31 || iVar31 == iVar9 && bVar4) & 1)) {
        local_128.m_data[uVar18 + uVar16 + 3] = 0.0001;
      }
      if (iVar9 >= iVar31 && (iVar31 != iVar9 || !bVar4)) {
        local_128.m_data[uVar18 + uVar16 + 4] = 0.0001;
      }
      uVar16 = uVar16 + 2;
    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar16);
  }
  auVar7 = _DAT_00183040;
  auVar6 = _DAT_00183020;
  if (local_128.m_rows < 0xc) {
LAB_0014f39e:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar11 = local_128.m_data + 9;
  uVar16 = 3;
  if (((ulong)pdVar11 & 7) == 0) {
    uVar16 = (ulong)((uint)((ulong)pdVar11 >> 3) & 1);
  }
  uVar14 = uVar16 ^ 3;
  uVar15 = (ulong)((uint)(1 < uVar14) * 2);
  uVar18 = uVar15 + uVar16;
  if (uVar16 != 0) {
    lVar19 = uVar16 - 1;
    auVar24._8_4_ = (int)lVar19;
    auVar24._0_8_ = lVar19;
    auVar24._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar17 = 0;
    auVar24 = auVar24 ^ _DAT_00183020;
    auVar27 = _DAT_00183010;
    do {
      bVar4 = auVar24._0_4_ < SUB164(auVar27 ^ auVar6,0);
      iVar9 = auVar24._4_4_;
      iVar31 = SUB164(auVar27 ^ auVar6,4);
      if ((bool)(~(iVar9 < iVar31 || iVar31 == iVar9 && bVar4) & 1)) {
        *(undefined8 *)((long)local_128.m_data + uVar17 + 0x48) = 0x3f1a36e2eb1c432d;
      }
      if (iVar9 >= iVar31 && (iVar31 != iVar9 || !bVar4)) {
        *(undefined8 *)((long)local_128.m_data + uVar17 + 0x50) = 0x3f1a36e2eb1c432d;
      }
      lVar19 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + auVar7._0_8_;
      auVar27._8_8_ = lVar19 + auVar7._8_8_;
      uVar17 = uVar17 + 0x10;
    } while (((int)uVar16 * 8 + 8U & 0xfffffff0) != uVar17);
    if ((uint)uVar14 < 2) goto LAB_0014efb8;
  }
  do {
    pdVar11[uVar16] = 0.0001;
    (pdVar11 + uVar16)[1] = 0.0001;
    uVar16 = uVar16 + 2;
  } while (uVar16 < uVar18);
LAB_0014efb8:
  auVar7 = _DAT_00183020;
  auVar6 = _DAT_00183010;
  if ((uint)uVar18 < 3) {
    lVar19 = uVar14 - uVar15;
    lVar20 = lVar19 + -1;
    auVar25._8_4_ = (int)lVar20;
    auVar25._0_8_ = lVar20;
    auVar25._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar16 = 0;
    auVar25 = auVar25 ^ _DAT_00183020;
    do {
      auVar30._8_4_ = (int)uVar16;
      auVar30._0_8_ = uVar16;
      auVar30._12_4_ = (int)(uVar16 >> 0x20);
      auVar21 = (auVar30 | auVar6) ^ auVar7;
      bVar4 = auVar25._0_4_ < auVar21._0_4_;
      iVar9 = auVar25._4_4_;
      iVar31 = auVar21._4_4_;
      if ((bool)(~(iVar9 < iVar31 || iVar31 == iVar9 && bVar4) & 1)) {
        local_128.m_data[uVar18 + uVar16 + 9] = 0.0001;
      }
      if (iVar9 >= iVar31 && (iVar31 != iVar9 || !bVar4)) {
        local_128.m_data[uVar18 + uVar16 + 10] = 0.0001;
      }
      uVar16 = uVar16 + 2;
    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar16);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_c8,&local_128);
  EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
            (&this->super_EKFFlexibilityEstimatorBase,(Vector *)&local_c8);
  free(local_c8.m_data);
  ObserverBase::stateVectorZero(&local_f0);
  pp_Var8 = local_f0._vptr_ObserverBase;
  this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
  if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != local_f0.n_
     ) {
    if (local_f0.n_ < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_01,local_f0.n_,local_f0.n_,1);
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        local_f0.n_) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar11 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar16 = local_f0.n_ - (local_f0.n_ >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_f0.n_) {
    lVar19 = 0;
    do {
      pp_Var2 = pp_Var8 + lVar19;
      p_Var5 = pp_Var2[1];
      pdVar3 = pdVar11 + lVar19;
      *pdVar3 = (double)*pp_Var2;
      pdVar3[1] = (double)p_Var5;
      lVar19 = lVar19 + 2;
    } while (lVar19 < (long)uVar16);
  }
  if ((long)uVar16 < local_f0.n_) {
    do {
      pdVar11[uVar16] = (double)pp_Var8[uVar16];
      uVar16 = uVar16 + 1;
    } while (local_f0.n_ != uVar16);
  }
  ZeroDelayObserver::setState((ZeroDelayObserver *)pEVar1,(StateVector *)&local_f0,0);
  KalmanFilterBase::setStateCovariance(&pEVar1->super_KalmanFilterBase,&this->Q_);
  ExtendedKalmanFilter::setFunctor(pEVar1,&this_00->super_DynamicalSystemFunctorBase);
  IMUElasticLocalFrameDynamicalSystem::setFDstep
            (this_00,&(this->super_EKFFlexibilityEstimatorBase).dx_);
  this->on_ = true;
  local_110.m_xpr = &local_98;
  local_110.m_row = 0;
  local_110.m_col = 1;
  local_110.m_currentBlockRows = 1;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       100.0;
  local_d0 = 100.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_110,&local_d0);
  local_f0.p_ = 0x408f400000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar12,(Scalar *)&local_f0.p_);
  if ((local_110.m_currentBlockRows + local_110.m_row == 3) && (local_110.m_col == 1)) {
    local_110.m_xpr = &local_b8;
    local_110.m_row = 0;
    local_110.m_col = 1;
    local_110.m_currentBlockRows = 1;
    local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 10.0;
    local_d0 = 10.0;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (&local_110,&local_d0);
    local_f0.p_ = 0x4059000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar12,(Scalar *)&local_f0.p_);
    if ((local_110.m_currentBlockRows + local_110.m_row == 3) && (local_110.m_col == 1)) {
      local_78._0_16_ = (undefined1  [16])0x0;
      local_78.m_lhs.m_cols.m_value = 0x4081651eb851eb85;
      local_78.m_lhs._16_8_ = 0;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] =
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 556.64;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] =
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 556.64 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 556.64 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] =
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 556.64;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] =
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 0.0 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 556.64 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * 556.64 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] * 0.0 +
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] * 0.0;
      free(local_f0._vptr_ObserverBase);
      free(local_128.m_data);
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt)
: EKFFlexibilityEstimatorBase(stateSize,
                              measurementSizeBase_,
                              inputSizeBase_,
                              Matrix::Constant(stateSize, 1, dxFactor)),
  functor_(dt), stateSize_(stateSize), unmodeledForceVariance_(1e-6), forceVariance_(Matrix::Identity(6, 6) * 1e-4),
  absPosVariance_(1e-4), useFTSensors_(false), withAbsolutePos_(false), withComBias_(false),
  withUnmodeledForces_(false), limitOn_(true)
{
  ekf_.setMeasureSize(functor_.getMeasurementSize());
  ekf_.setStateSize(stateSize_);
  ekf_.setInputSize(functor_.getInputSize());
  inputSize_ = functor_.getInputSize();

  ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

  Vector dx(Matrix::Constant(getStateSize(), 1, dxFactor));

  dx.segment(state::ori, 3).fill(1e-4);
  dx.segment(state::angVel, 3).fill(1e-4);

  ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

  Vector x0(ekf_.stateVectorZero());

  lastX_ = x0;
  ekf_.setState(x0, 0);

  ekf_.setStateCovariance(Q_);

  ekf_.setFunctor(&functor_);

  functor_.setFDstep(dx_);

  on_ = true;

  Vector3 v1, v2;
  Matrix3 v;
  v1 << 100, 100, 1000;
  v2 << 10, 10, 100;
  v.setIdentity();
  v *= cst::gravityConstant * hrp2::m;
  limitForces_ = v * v1;
  limitTorques_ = v * v2;
}